

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

MPP_RET str_to_frm_fmt(char *nptr,long *number)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  char *endptr;
  char *local_30;
  
  if (nptr == (char *)0x0 || number == (long *)0x0) {
    _mpp_log_l(2,"utils","invalid input nptr %p number %p is_valid %p\n","str_to_frm_fmt",nptr,
               number);
    return MPP_ERR_NULL_PTR;
  }
  local_30 = (char *)0x0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  uVar3 = strtol(nptr,&local_30,0);
  if (local_30 == nptr) {
    pcVar4 = "format: 0x%lx  invalid  (no digits found, 0 returned)";
  }
  else {
    iVar1 = *piVar2;
    if (uVar3 == 0x8000000000000000 && iVar1 == 0x22) {
      pcVar4 = "format: 0x%lx  invalid  (underflow occurred)";
      uVar3 = 0x8000000000000000;
    }
    else if (uVar3 == 0x7fffffffffffffff && iVar1 == 0x22) {
      pcVar4 = "format: 0x%lx  invalid  (overflow occurred)";
      uVar3 = 0x7fffffffffffffff;
    }
    else if (iVar1 == 0x16) {
      pcVar4 = "format: 0x%lx  invalid  (base contains unsupported value)";
    }
    else {
      if (uVar3 != 0 || iVar1 == 0) {
        if (iVar1 != 0) {
          return MPP_NOK;
        }
        if (*local_30 == '\0') {
          if (uVar3 < 0xff10011) {
            *number = uVar3;
            return MPP_OK;
          }
          pcVar4 = "format: 0x%lx  invalid  (not format value)";
        }
        else {
          pcVar4 = "format: 0x%lx  invalid  (additional characters remain)";
        }
        _mpp_log_l(2,"utils",pcVar4,0,uVar3);
        return MPP_NOK;
      }
      pcVar4 = "format: 0x%lx  invalid  (unspecified error occurred)";
      uVar3 = 0;
    }
  }
  _mpp_log_l(2,"utils",pcVar4,0,uVar3);
  return MPP_NOK;
}

Assistant:

MPP_RET str_to_frm_fmt(const char *nptr, long *number)
{
    MPP_RET ret = MPP_NOK;

    if (NULL == nptr || NULL == number) {
        mpp_err_f("invalid input nptr %p number %p is_valid %p\n", nptr, number);
        ret = MPP_ERR_NULL_PTR;
        goto RET;
    }

    if (nptr) {
        char *endptr = NULL;  /* pointer to additional chars  */
        long  tmp = 0;

        /* reset errno to 0 before call */
        errno = 0;

        tmp = strtol(nptr, &endptr, 0);

        if (nptr == endptr)
            mpp_err("format: 0x%lx  invalid  (no digits found, 0 returned)", tmp);
        else if (errno == ERANGE && tmp == LONG_MIN)
            mpp_err("format: 0x%lx  invalid  (underflow occurred)", tmp);
        else if (errno == ERANGE && tmp == LONG_MAX)
            mpp_err("format: 0x%lx  invalid  (overflow occurred)", tmp);
        else if (errno == EINVAL)  /* not in all c99 implementations - gcc OK */
            mpp_err("format: 0x%lx  invalid  (base contains unsupported value)", tmp);
        else if (errno != 0 && tmp == 0)
            mpp_err("format: 0x%lx  invalid  (unspecified error occurred)", tmp);
        else if (errno == 0 && nptr && *endptr != 0)
            mpp_err("format: 0x%lx  invalid  (additional characters remain)", tmp);
        else if (errno == 0 && nptr && !*endptr) {
            if ((tmp < (MPP_FMT_BUTT | MPP_FRAME_FMT_PROP_MASK)) && tmp >= 0) {
                *number = tmp;
                ret = MPP_OK;
            } else {
                mpp_err("format: 0x%lx  invalid  (not format value)", tmp);
            }
        }
    }

RET:
    return ret;
}